

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_lock_posix.cc
# Opt level: O0

RWLockPosix * webrtc::RWLockPosix::Create(void)

{
  bool bVar1;
  RWLockPosix *ret_val;
  
  ret_val = (RWLockPosix *)operator_new(0x40);
  RWLockPosix(ret_val);
  bVar1 = Init(ret_val);
  if (!bVar1) {
    if (ret_val != (RWLockPosix *)0x0) {
      (*(ret_val->super_RWLockWrapper)._vptr_RWLockWrapper[1])();
    }
    ret_val = (RWLockPosix *)0x0;
  }
  return ret_val;
}

Assistant:

RWLockPosix* RWLockPosix::Create() {
  RWLockPosix* ret_val = new RWLockPosix();
  if (!ret_val->Init()) {
    delete ret_val;
    return NULL;
  }
  return ret_val;
}